

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ssl-Example.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Bind<void_(*(bool_*))(const_bool_*)> local_78;
  thread local_68;
  thread thClient;
  int local_4c;
  duration<long,_std::ratio<1L,_1000L>_> local_48;
  undefined1 *local_40;
  _Bind<void_(*(bool_*))(const_bool_*)> local_38;
  thread local_28;
  thread thServer;
  bool bStop;
  char **argv_local;
  int argc_local;
  
  thServer._M_id._M_thread._7_1_ = 0;
  local_40 = (undefined1 *)((long)&thServer._M_id._M_thread + 7);
  std::bind<void(&)(bool_const*),bool*>((_func_void_bool_ptr *)&local_38,(bool **)ServerThread);
  std::thread::thread<std::_Bind<void(*(bool*))(bool_const*)>,,void>(&local_28,&local_38);
  local_4c = 1000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_48,&local_4c);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_48);
  std::bind<void(&)(bool_const*),bool*>((_func_void_bool_ptr *)&local_78,(bool **)ClientThread);
  std::thread::thread<std::_Bind<void(*(bool*))(bool_const*)>,,void>(&local_68,&local_78);
  _getch();
  thServer._M_id._M_thread._7_1_ = 1;
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_68);
  std::thread::~thread(&local_28);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
#if defined(_WIN32) || defined(_WIN64)
    // Detect Memory Leaks
    _CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF | _CrtSetDbgFlag(_CRTDBG_REPORT_FLAG));
#endif

    bool bStop = false;
    thread thServer = thread(bind(ServerThread, &bStop));
    // we wait a second so the server is ready
    this_thread::sleep_for(chrono::milliseconds(1000));
    thread thClient = thread(bind(ClientThread, &bStop));

    _getch();

    bStop = true;

    thServer.join();
    thClient.join();

    return 0;
}